

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly2_from_poly(poly2 *out,poly *in)

{
  uint local_34;
  ulong uStack_30;
  uint i;
  crypto_word_t word;
  crypto_word_t *pcStack_20;
  uint shift;
  crypto_word_t *words;
  poly *in_local;
  poly2 *out_local;
  
  word._4_4_ = 0;
  uStack_30 = 0;
  local_34 = 0;
  pcStack_20 = out->v;
  for (; local_34 < 0x2bd; local_34 = local_34 + 1) {
    uStack_30 = (long)(int)((in->field_0).v[local_34] & 1) << 0x3f | uStack_30 >> 1;
    word._4_4_ = word._4_4_ + 1;
    if (word._4_4_ == 0x40) {
      *pcStack_20 = uStack_30;
      pcStack_20 = pcStack_20 + 1;
      uStack_30 = 0;
      word._4_4_ = 0;
    }
  }
  *pcStack_20 = uStack_30 >> (0x40U - (char)word._4_4_ & 0x3f);
  return;
}

Assistant:

static void poly2_from_poly(struct poly2 *out, const struct poly *in) {
  crypto_word_t *words = out->v;
  unsigned shift = 0;
  crypto_word_t word = 0;

  for (unsigned i = 0; i < N; i++) {
    word >>= 1;
    word |= (crypto_word_t)(in->v[i] & 1) << (BITS_PER_WORD - 1);
    shift++;

    if (shift == BITS_PER_WORD) {
      *words = word;
      words++;
      word = 0;
      shift = 0;
    }
  }

  word >>= BITS_PER_WORD - shift;
  *words = word;
}